

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void av1_calc_mb_wiener_var_mt
               (AV1_COMP *cpi,int num_workers,double *sum_rec_distortion,double *sum_est_rate)

{
  AV1_PRIMARY *pAVar1;
  EncWorkerData *pEVar2;
  AVxWorker *pAVar3;
  ThreadData_conflict *pTVar4;
  ulong uVar5;
  int iVar6;
  AVxWorkerInterface *pAVar7;
  long lVar8;
  ThreadData_conflict *__dest;
  AVxWorker *pAVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  
  uVar5 = (ulong)(uint)num_workers;
  pAVar1 = cpi->ppi;
  iVar10 = (cpi->common).mi_params.mi_rows;
  row_mt_sync_mem_alloc(&pAVar1->intra_row_mt_sync,&cpi->common,iVar10);
  (pAVar1->intra_row_mt_sync).intrabc_extra_top_right_sb_delay = 0;
  (pAVar1->intra_row_mt_sync).num_threads_working = num_workers;
  (pAVar1->intra_row_mt_sync).next_mi_row = 0;
  memset((pAVar1->intra_row_mt_sync).num_finished_cols,0xff,(long)iVar10 << 2);
  (cpi->mt_info).enc_row_mt.mb_wiener_mt_exit = false;
  if (0 < num_workers) {
    pTVar4 = &cpi->td;
    lVar11 = uVar5 + 1;
    lVar8 = uVar5 * 0x38;
    lVar12 = uVar5 * 0x1d0;
    do {
      pAVar9 = (cpi->mt_info).workers;
      pEVar2 = (cpi->mt_info).tile_thr_data;
      *(code **)((long)pAVar9 + lVar8 + -0x20) = cal_mb_wiener_var_hook;
      *(char **)((long)pAVar9 + lVar8 + -0x18) = pEVar2[-1].error_info.detail + lVar12 + -0x20;
      *(undefined8 *)((long)pAVar9 + lVar8 + -0x10) = 0;
      *(int *)((long)&pEVar2[-1].thread_id + lVar12) = (int)lVar11 + -2;
      *(undefined4 *)((long)&pEVar2[-1].start + lVar12) = 0;
      *(AV1_COMP **)(pEVar2[-1].error_info.detail + lVar12 + -0x20) = cpi;
      __dest = pTVar4;
      if (lVar11 != 2) {
        __dest = *(ThreadData_conflict **)(pEVar2[-1].error_info.detail + lVar12 + -0x10);
      }
      *(ThreadData_conflict **)(pEVar2[-1].error_info.detail + lVar12 + -0x18) = __dest;
      if (__dest != pTVar4) {
        memcpy(__dest,pTVar4,0x256b0);
        av1_alloc_mb_wiener_var_pred_buf
                  (&cpi->common,
                   *(ThreadData_conflict **)(pEVar2[-1].error_info.detail + lVar12 + -0x18));
      }
      lVar11 = lVar11 + -1;
      lVar8 = lVar8 + -0x38;
      lVar12 = lVar12 + -0x1d0;
    } while (1 < lVar11);
  }
  pAVar7 = aom_get_worker_interface();
  if (0 < num_workers) {
    lVar11 = uVar5 + 1;
    lVar12 = uVar5 * 0x38;
    do {
      pAVar9 = (cpi->mt_info).workers;
      *(undefined4 *)((long)&pAVar9[-1].had_error + lVar12) = 0;
      pAVar9 = (AVxWorker *)((long)&pAVar9[-1].impl_ + lVar12);
      if (lVar11 == 2) {
        (*pAVar7->execute)(pAVar9);
      }
      else {
        (*pAVar7->launch)(pAVar9);
      }
      lVar11 = lVar11 + -1;
      lVar12 = lVar12 + -0x38;
    } while (1 < lVar11);
  }
  pAVar7 = aom_get_worker_interface();
  pAVar9 = (cpi->mt_info).workers;
  iVar10 = pAVar9->had_error;
  if (iVar10 != 0) {
    memcpy(&local_1d0,(void *)((long)pAVar9->data1 + 0x18),0x1a0);
  }
  if (1 < num_workers) {
    lVar11 = uVar5 + 1;
    lVar12 = uVar5 * 0x38;
    do {
      pAVar3 = (cpi->mt_info).workers;
      iVar6 = (*pAVar7->sync)((AVxWorker *)((long)&pAVar3[-1].impl_ + lVar12));
      if (iVar6 == 0) {
        memcpy(&local_1d0,(void *)(*(long *)((long)&pAVar3[-1].data1 + lVar12) + 0x18),0x1a0);
        iVar10 = 1;
      }
      lVar11 = lVar11 + -1;
      lVar12 = lVar12 + -0x38;
    } while (2 < lVar11);
  }
  if (iVar10 != 0) {
    aom_internal_error_copy((cpi->common).error,&local_1d0);
  }
  *(aom_internal_error_info **)(*(long *)((long)pAVar9->data1 + 8) + 0x2b90) = (cpi->common).error;
  av1_row_mt_sync_mem_dealloc(&cpi->ppi->intra_row_mt_sync);
  if (0 < num_workers) {
    lVar11 = 0;
    do {
      pTVar4 = *(ThreadData_conflict **)
                ((((cpi->mt_info).tile_thr_data)->error_info).detail + lVar11 + -0x18);
      if (pTVar4 != &cpi->td) {
        av1_dealloc_mb_wiener_var_pred_buf(pTVar4);
      }
      lVar11 = lVar11 + 0x1d0;
    } while (uVar5 * 0x1d0 - lVar11 != 0);
  }
  return;
}

Assistant:

void av1_calc_mb_wiener_var_mt(AV1_COMP *cpi, int num_workers,
                               double *sum_rec_distortion,
                               double *sum_est_rate) {
  (void)sum_rec_distortion;
  (void)sum_est_rate;
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadSync *const intra_row_mt_sync =
      &cpi->ppi->intra_row_mt_sync;

  // TODO(chengchen): the memory usage could be improved.
  const int mi_rows = cm->mi_params.mi_rows;
  row_mt_sync_mem_alloc(intra_row_mt_sync, cm, mi_rows);

  intra_row_mt_sync->intrabc_extra_top_right_sb_delay = 0;
  intra_row_mt_sync->num_threads_working = num_workers;
  intra_row_mt_sync->next_mi_row = 0;
  memset(intra_row_mt_sync->num_finished_cols, -1,
         sizeof(*intra_row_mt_sync->num_finished_cols) * mi_rows);
  mt_info->enc_row_mt.mb_wiener_mt_exit = false;

  prepare_wiener_var_workers(cpi, cal_mb_wiener_var_hook, num_workers);
  launch_workers(mt_info, num_workers);
  sync_enc_workers(mt_info, cm, num_workers);
  dealloc_mb_wiener_var_mt_data(cpi, num_workers);
}